

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int robust_open(char *z,int f,mode_t m)

{
  int iVar1;
  int *piVar2;
  uint in_EDX;
  uint in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  mode_t m2;
  int fd;
  stat statbuf;
  uint local_b4;
  uint local_ac;
  undefined1 local_98 [24];
  uint local_80;
  long local_68;
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  local_b4 = in_EDX;
  if (in_EDX == 0) {
    local_b4 = 0x1a4;
  }
  do {
    while (local_ac = (*aSyscall[0].pCurrent)(in_RDI,(ulong)(in_ESI | 0x80000),(ulong)local_b4),
          (int)local_ac < 0) {
      piVar2 = __errno_location();
      if (*piVar2 != 4) goto LAB_00155070;
    }
    if (2 < (int)local_ac) break;
    if ((in_ESI & 0xc0) == 0xc0) {
      (*aSyscall[0x10].pCurrent)(in_RDI);
    }
    (*aSyscall[1].pCurrent)((ulong)local_ac);
    sqlite3_log(0x1c,"attempt to open \"%s\" as file descriptor %d",in_RDI,(ulong)local_ac);
    local_ac = 0xffffffff;
    iVar1 = (*aSyscall[0].pCurrent)("/dev/null",0,(ulong)in_EDX);
  } while (-1 < iVar1);
LAB_00155070:
  if ((-1 < (int)local_ac) && (in_EDX != 0)) {
    memset(local_98,0xaa,0x90);
    iVar1 = (*aSyscall[5].pCurrent)((ulong)local_ac,local_98);
    if ((iVar1 == 0) && ((local_68 == 0 && ((local_80 & 0x1ff) != in_EDX)))) {
      (*aSyscall[0xe].pCurrent)((ulong)local_ac,(ulong)in_EDX);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return local_ac;
}

Assistant:

static int robust_open(const char *z, int f, mode_t m){
  int fd;
  mode_t m2 = m ? m : SQLITE_DEFAULT_FILE_PERMISSIONS;
  while(1){
#if defined(O_CLOEXEC)
    fd = osOpen(z,f|O_CLOEXEC,m2);
#else
    fd = osOpen(z,f,m2);
#endif
    if( fd<0 ){
      if( errno==EINTR ) continue;
      break;
    }
    if( fd>=SQLITE_MINIMUM_FILE_DESCRIPTOR ) break;
    if( (f & (O_EXCL|O_CREAT))==(O_EXCL|O_CREAT) ){
      (void)osUnlink(z);
    }
    osClose(fd);
    sqlite3_log(SQLITE_WARNING,
                "attempt to open \"%s\" as file descriptor %d", z, fd);
    fd = -1;
    if( osOpen("/dev/null", O_RDONLY, m)<0 ) break;
  }
  if( fd>=0 ){
    if( m!=0 ){
      struct stat statbuf;
      if( osFstat(fd, &statbuf)==0
       && statbuf.st_size==0
       && (statbuf.st_mode&0777)!=m
      ){
        osFchmod(fd, m);
      }
    }
#if defined(FD_CLOEXEC) && (!defined(O_CLOEXEC) || O_CLOEXEC==0)
    osFcntl(fd, F_SETFD, osFcntl(fd, F_GETFD, 0) | FD_CLOEXEC);
#endif
  }
  return fd;
}